

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_control_mobile.cc
# Opt level: O2

int32_t WebRtcAecm_Process(void *aecmInst,int16_t *nearendNoisy,int16_t *nearendClean,int16_t *out,
                          size_t nrOfSamples,int16_t msInSndCardBuf)

{
  RingBuffer *self;
  uint uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  short sVar4;
  short sVar5;
  ulong uVar6;
  size_t sVar7;
  int16_t *nearendClean_00;
  short sVar8;
  int32_t iVar9;
  short sVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  double dVar14;
  int16_t *farend_ptr;
  int32_t local_f4;
  int16_t *local_f0;
  int *local_e8;
  ulong local_e0;
  int16_t farend [80];
  
  if (aecmInst == (void *)0x0) {
    return -1;
  }
  if (out == (int16_t *)0x0 || nearendNoisy == (int16_t *)0x0) {
    return 0x2ee3;
  }
  if (*(short *)((long)aecmInst + 0x150) != 0x2a) {
    return 0x2ee2;
  }
  if ((nrOfSamples != 0xa0) && (nrOfSamples != 0x50)) {
    return 0x2ee4;
  }
  sVar4 = 500;
  if (msInSndCardBuf < 500) {
    sVar4 = msInSndCardBuf;
  }
  iVar9 = 0x2f44;
  if ((ushort)msInSndCardBuf < 0x1f5) {
    iVar9 = 0;
  }
  if (sVar4 < 1) {
    sVar4 = 0;
  }
  *(short *)((long)aecmInst + 0x15a) = sVar4 + 10;
  local_e0 = (ulong)(byte)(((ushort)nrOfSamples & 0xff) / 0x50);
  uVar6 = local_e0 / (ulong)(long)*(short *)(*(long *)((long)aecmInst + 0x180) + 0x238);
  if (*(int *)((long)aecmInst + 0x164) == 0) {
    lVar13 = 0;
    uVar6 = 0;
    local_f4 = iVar9;
    local_f0 = out;
    local_e8 = (int *)aecmInst;
    do {
      if (local_e0 == uVar6) {
        return local_f4;
      }
      farend_ptr = (int16_t *)0x0;
      sVar7 = WebRtc_available_read(*(RingBuffer **)((long)aecmInst + 0x178));
      if ((short)sVar7 < 0x50) {
        memcpy(farend,(void *)((long)aecmInst + lVar13 + 0x10),0xa0);
        aecmInst = local_e8;
        farend_ptr = farend;
      }
      else {
        WebRtc_ReadBuffer(*(RingBuffer **)((long)aecmInst + 0x178),&farend_ptr,farend,0x50);
        memcpy((void *)((long)aecmInst + lVar13 + 0x10),farend_ptr,0xa0);
      }
      if (uVar6 == 1) {
        if (*aecmInst == 16000) goto LAB_00170210;
      }
      else if ((uVar6 == 0) && (*aecmInst == 8000)) {
LAB_00170210:
        sVar4 = *(short *)((long)aecmInst + 0x15a);
        sVar7 = WebRtc_available_read(*(RingBuffer **)((long)aecmInst + 0x178));
        sVar4 = sVar4 * *(short *)(*(long *)((long)aecmInst + 0x180) + 0x238) * 8 - (short)sVar7;
        if (sVar4 < 0x50) {
          WebRtc_MoveReadPtr(*(RingBuffer **)((long)aecmInst + 0x178),0x50);
          sVar4 = sVar4 + 0x50;
        }
        iVar11 = sVar4 * 2 + (short)*(int *)((long)aecmInst + 0x15c) * 8;
        sVar4 = (short)(iVar11 / 10);
        if (iVar11 < -9) {
          sVar4 = 0;
        }
        *(short *)((long)aecmInst + 0x15c) = sVar4;
        sVar10 = sVar4 - (short)*(int *)((long)aecmInst + 0xc);
        out = local_f0;
        if (sVar10 < 0xe1) {
          if (((*(int *)((long)aecmInst + 0xc) < 1) || (0x5f < sVar10)) ||
             (0xe0 < (short)*(int *)((long)aecmInst + 0x170))) goto LAB_001702b8;
        }
        else if ((short)*(int *)((long)aecmInst + 0x170) < 0x60) {
LAB_001702b8:
          *(int *)((long)aecmInst + 0x160) = 0;
          *(short *)((long)aecmInst + 0x170) = sVar10;
          goto LAB_001702f6;
        }
        iVar11 = *(int *)((long)aecmInst + 0x160);
        *(int *)((long)aecmInst + 0x160) = iVar11 + 1;
        *(short *)((long)aecmInst + 0x170) = sVar10;
        if (0x18 < iVar11) {
          if (sVar4 < 0xa1) {
            iVar11 = 0;
          }
          else {
            iVar11 = sVar4 + -0xa0;
          }
          *(int *)((long)aecmInst + 0xc) = iVar11;
        }
      }
LAB_001702f6:
      nearendClean_00 = (int16_t *)((long)nearendClean + lVar13);
      if (nearendClean == (int16_t *)0x0) {
        nearendClean_00 = (int16_t *)0x0;
      }
      iVar11 = WebRtcAecm_ProcessFrame
                         (*(AecmCore **)((long)aecmInst + 0x180),farend_ptr,
                          (int16_t *)((long)nearendNoisy + lVar13),nearendClean_00,
                          (int16_t *)((long)out + lVar13));
      uVar6 = uVar6 + 1;
      lVar13 = lVar13 + 0xa0;
      if (iVar11 == -1) {
        return -1;
      }
    } while( true );
  }
  if (nearendClean == (int16_t *)0x0) {
    nearendClean = nearendNoisy;
    if (out != nearendNoisy) goto LAB_001700df;
  }
  else if (out != nearendClean) {
LAB_001700df:
    memcpy(out,nearendClean,nrOfSamples * 2);
  }
  sVar7 = WebRtc_available_read(*(RingBuffer **)((long)aecmInst + 0x178));
  sVar4 = (short)sVar7 / 0x50;
  if (*(int *)((long)aecmInst + 0x168) != 0) {
    sVar10 = (short)*(undefined4 *)((long)aecmInst + 0x158) + 1;
    *(short *)((long)aecmInst + 0x158) = sVar10;
    if (*(short *)((long)aecmInst + 0x152) == 0) {
      sVar8 = *(short *)((long)aecmInst + 0x15a);
      *(short *)((long)aecmInst + 0x156) = sVar8;
      *(undefined2 *)((long)aecmInst + 0x154) = 0;
      sVar5 = sVar8;
    }
    else {
      sVar8 = *(short *)((long)aecmInst + 0x156);
      sVar5 = *(short *)((long)aecmInst + 0x15a);
    }
    iVar11 = (int)sVar5;
    uVar12 = sVar8 - iVar11;
    uVar1 = -uVar12;
    if (0 < (int)uVar12) {
      uVar1 = uVar12;
    }
    dVar14 = (double)iVar11 * 0.2;
    if (dVar14 <= 8.0) {
      dVar14 = 8.0;
    }
    if (dVar14 <= (double)(uVar1 & 0xffff)) {
      sVar8 = 0;
    }
    else {
      *(short *)((long)aecmInst + 0x154) = *(short *)((long)aecmInst + 0x154) + sVar5;
      sVar8 = *(short *)((long)aecmInst + 0x152) + 1;
    }
    *(short *)((long)aecmInst + 0x152) = sVar8;
    uVar2 = 0x32;
    if ((long)sVar8 * uVar6 < 6) {
      if (uVar6 * (long)sVar10 < 0x33) {
        return iVar9;
      }
    }
    else {
      lVar13 = (long)((int)*(short *)(*(long *)((long)aecmInst + 0x180) + 0x238) *
                      (int)*(short *)((long)aecmInst + 0x154) * 3) / (long)(sVar8 * 0x28);
      uVar3 = (short)lVar13;
      if (0x31 < (int)lVar13) {
        uVar3 = uVar2;
      }
      *(undefined2 *)((long)aecmInst + 8) = uVar3;
      *(undefined4 *)((long)aecmInst + 0x168) = 0;
      if (uVar6 * (long)sVar10 < 0x33) goto LAB_00170452;
    }
    iVar11 = iVar11 * *(short *)(*(long *)((long)aecmInst + 0x180) + 0x238) * 3;
    if (iVar11 < 2000) {
      uVar2 = (undefined2)(iVar11 / 0x28);
    }
    *(undefined2 *)((long)aecmInst + 8) = uVar2;
    *(undefined4 *)((long)aecmInst + 0x168) = 0;
  }
LAB_00170452:
  if (sVar4 != *(short *)((long)aecmInst + 8)) {
    if (sVar4 <= *(short *)((long)aecmInst + 8)) {
      return iVar9;
    }
    self = *(RingBuffer **)((long)aecmInst + 0x178);
    sVar7 = WebRtc_available_read(self);
    WebRtc_MoveReadPtr(self,*(short *)((long)aecmInst + 8) * -0x50 + (int)sVar7);
  }
  *(undefined4 *)((long)aecmInst + 0x164) = 0;
  return iVar9;
}

Assistant:

int32_t WebRtcAecm_Process(void *aecmInst, const int16_t *nearendNoisy,
                           const int16_t *nearendClean, int16_t *out,
                           size_t nrOfSamples, int16_t msInSndCardBuf)
{
    AecMobile* aecm = static_cast<AecMobile*>(aecmInst);
    int32_t retVal = 0;
    size_t i;
    short nmbrOfFilledBuffers;
    size_t nBlocks10ms;
    size_t nFrames;
#ifdef AEC_DEBUG
    short msInAECBuf;
#endif

    if (aecm == NULL)
    {
        return -1;
    }

    if (nearendNoisy == NULL)
    {
        return AECM_NULL_POINTER_ERROR;
    }

    if (out == NULL)
    {
        return AECM_NULL_POINTER_ERROR;
    }

    if (aecm->initFlag != kInitCheck)
    {
        return AECM_UNINITIALIZED_ERROR;
    }

    if (nrOfSamples != 80 && nrOfSamples != 160)
    {
        return AECM_BAD_PARAMETER_ERROR;
    }

    if (msInSndCardBuf < 0)
    {
        msInSndCardBuf = 0;
        retVal = AECM_BAD_PARAMETER_WARNING;
    } else if (msInSndCardBuf > 500)
    {
        msInSndCardBuf = 500;
        retVal = AECM_BAD_PARAMETER_WARNING;
    }
    msInSndCardBuf += 10;
    aecm->msInSndCardBuf = msInSndCardBuf;

    nFrames = nrOfSamples / FRAME_LEN;
    nBlocks10ms = nFrames / aecm->aecmCore->mult;

    if (aecm->ECstartup)
    {
        if (nearendClean == NULL)
        {
            if (out != nearendNoisy)
            {
                memcpy(out, nearendNoisy, sizeof(short) * nrOfSamples);
            }
        } else if (out != nearendClean)
        {
            memcpy(out, nearendClean, sizeof(short) * nrOfSamples);
        }

        nmbrOfFilledBuffers =
            (short) WebRtc_available_read(aecm->farendBuf) / FRAME_LEN;
        // The AECM is in the start up mode
        // AECM is disabled until the soundcard buffer and farend buffers are OK

        // Mechanism to ensure that the soundcard buffer is reasonably stable.
        if (aecm->checkBuffSize)
        {
            aecm->checkBufSizeCtr++;
            // Before we fill up the far end buffer we require the amount of data on the
            // sound card to be stable (+/-8 ms) compared to the first value. This
            // comparison is made during the following 4 consecutive frames. If it seems
            // to be stable then we start to fill up the far end buffer.

            if (aecm->counter == 0)
            {
                aecm->firstVal = aecm->msInSndCardBuf;
                aecm->sum = 0;
            }

            if (abs(aecm->firstVal - aecm->msInSndCardBuf)
                    < WEBRTC_SPL_MAX(0.2 * aecm->msInSndCardBuf, kSampMsNb))
            {
                aecm->sum += aecm->msInSndCardBuf;
                aecm->counter++;
            } else
            {
                aecm->counter = 0;
            }

            if (aecm->counter * nBlocks10ms >= 6)
            {
                // The farend buffer size is determined in blocks of 80 samples
                // Use 75% of the average value of the soundcard buffer
                aecm->bufSizeStart
                        = WEBRTC_SPL_MIN((3 * aecm->sum
                                        * aecm->aecmCore->mult) / (aecm->counter * 40), BUF_SIZE_FRAMES);
                // buffersize has now been determined
                aecm->checkBuffSize = 0;
            }

            if (aecm->checkBufSizeCtr * nBlocks10ms > 50)
            {
                // for really bad sound cards, don't disable echocanceller for more than 0.5 sec
                aecm->bufSizeStart = WEBRTC_SPL_MIN((3 * aecm->msInSndCardBuf
                                * aecm->aecmCore->mult) / 40, BUF_SIZE_FRAMES);
                aecm->checkBuffSize = 0;
            }
        }

        // if checkBuffSize changed in the if-statement above
        if (!aecm->checkBuffSize)
        {
            // soundcard buffer is now reasonably stable
            // When the far end buffer is filled with approximately the same amount of
            // data as the amount on the sound card we end the start up phase and start
            // to cancel echoes.

            if (nmbrOfFilledBuffers == aecm->bufSizeStart)
            {
                aecm->ECstartup = 0; // Enable the AECM
            } else if (nmbrOfFilledBuffers > aecm->bufSizeStart)
            {
                WebRtc_MoveReadPtr(aecm->farendBuf,
                                   (int) WebRtc_available_read(aecm->farendBuf)
                                   - (int) aecm->bufSizeStart * FRAME_LEN);
                aecm->ECstartup = 0;
            }
        }

    } else
    {
        // AECM is enabled

        // Note only 1 block supported for nb and 2 blocks for wb
        for (i = 0; i < nFrames; i++)
        {
            int16_t farend[FRAME_LEN];
            const int16_t* farend_ptr = NULL;

            nmbrOfFilledBuffers =
                (short) WebRtc_available_read(aecm->farendBuf) / FRAME_LEN;

            // Check that there is data in the far end buffer
            if (nmbrOfFilledBuffers > 0)
            {
                // Get the next 80 samples from the farend buffer
                WebRtc_ReadBuffer(aecm->farendBuf, (void**) &farend_ptr, farend,
                                  FRAME_LEN);

                // Always store the last frame for use when we run out of data
                memcpy(&(aecm->farendOld[i][0]), farend_ptr,
                       FRAME_LEN * sizeof(short));
            } else
            {
                // We have no data so we use the last played frame
                memcpy(farend, &(aecm->farendOld[i][0]), FRAME_LEN * sizeof(short));
                farend_ptr = farend;
            }

            // Call buffer delay estimator when all data is extracted,
            // i,e. i = 0 for NB and i = 1 for WB
            if ((i == 0 && aecm->sampFreq == 8000) || (i == 1 && aecm->sampFreq == 16000))
            {
                WebRtcAecm_EstBufDelay(aecm, aecm->msInSndCardBuf);
            }

            // Call the AECM
            /*WebRtcAecm_ProcessFrame(aecm->aecmCore, farend, &nearend[FRAME_LEN * i],
             &out[FRAME_LEN * i], aecm->knownDelay);*/
            if (WebRtcAecm_ProcessFrame(aecm->aecmCore,
                                        farend_ptr,
                                        &nearendNoisy[FRAME_LEN * i],
                                        (nearendClean
                                         ? &nearendClean[FRAME_LEN * i]
                                         : NULL),
                                        &out[FRAME_LEN * i]) == -1)
                return -1;
        }
    }

#ifdef AEC_DEBUG
    msInAECBuf = (short) WebRtc_available_read(aecm->farendBuf) /
        (kSampMsNb * aecm->aecmCore->mult);
    fwrite(&msInAECBuf, 2, 1, aecm->bufFile);
    fwrite(&(aecm->knownDelay), sizeof(aecm->knownDelay), 1, aecm->delayFile);
#endif

    return retVal;
}